

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeComputeTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::genBuiltInSource_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,ShaderType shaderType)

{
  ostream *poVar1;
  ostringstream local_190 [8];
  ostringstream source;
  ShaderType shaderType_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,"${GLSL_VERSION_STRING}\n");
  switch((ulong)this & 0xffffffff) {
  case 0:
  case 1:
    break;
  case 2:
    poVar1 = std::operator<<((ostream *)local_190,"layout(points) in;\n");
    std::operator<<(poVar1,"layout(line_strip, max_vertices = 3) out;\n");
    break;
  case 3:
    poVar1 = std::operator<<((ostream *)local_190,"${GLSL_TESS_EXTENSION_STRING}\n");
    std::operator<<(poVar1,"layout(vertices = 10) out;\n");
    break;
  case 4:
    poVar1 = std::operator<<((ostream *)local_190,"${GLSL_TESS_EXTENSION_STRING}\n");
    std::operator<<(poVar1,"layout(triangles) in;\n");
    break;
  case 5:
    std::operator<<((ostream *)local_190,"layout (local_size_x = 1) in;\n");
  }
  poVar1 = std::operator<<((ostream *)local_190,"\n");
  poVar1 = std::operator<<(poVar1,"void main(void)\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<(poVar1,"${COMPUTE_BUILT_IN_CONSTANTS_STRING}");
  std::operator<<(poVar1,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

string genBuiltInSource (glu::ShaderType shaderType)
{
	std::ostringstream		source;
	source << "${GLSL_VERSION_STRING}\n";

	switch (shaderType)
	{
		case glu::SHADERTYPE_VERTEX:
		case glu::SHADERTYPE_FRAGMENT:
			break;

		case glu::SHADERTYPE_COMPUTE:
			source << "layout (local_size_x = 1) in;\n";
			break;

		case glu::SHADERTYPE_GEOMETRY:
			source << "layout(points) in;\n"
				   << "layout(line_strip, max_vertices = 3) out;\n";
			break;

		case glu::SHADERTYPE_TESSELLATION_CONTROL:
			source << "${GLSL_TESS_EXTENSION_STRING}\n"
				   << "layout(vertices = 10) out;\n";
			break;

		case glu::SHADERTYPE_TESSELLATION_EVALUATION:
			source << "${GLSL_TESS_EXTENSION_STRING}\n"
				   << "layout(triangles) in;\n";
			break;

		default:
			DE_FATAL("Unknown shader type");
			break;
	}

	source	<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "${COMPUTE_BUILT_IN_CONSTANTS_STRING}"
			<< "}\n";

	return source.str();
}